

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogWrapper.cpp
# Opt level: O0

bool __thiscall
LogWrapper::WriteHex
          (LogWrapper *this,Location *location,int type,char *data,unsigned_short dataLen,
          char *format,...)

{
  char *pcVar1;
  ulong uVar2;
  undefined8 uVar3;
  long lVar4;
  long lVar5;
  undefined1 local_78 [8];
  string str;
  va_list args;
  char *format_local;
  unsigned_short dataLen_local;
  char *data_local;
  int type_local;
  Location *location_local;
  LogWrapper *this_local;
  
  memset(this->m_buf,0,0x25800);
  str.field_2._12_4_ = 0x30;
  str.field_2._8_4_ = 0x30;
  dd::Location::ToString_abi_cxx11_((string *)local_78,location);
  uVar2 = std::__cxx11::string::length();
  if (uVar2 < 0x25800) {
    pcVar1 = this->m_buf;
    uVar3 = std::__cxx11::string::c_str();
    sprintf(pcVar1,"%s ",uVar3);
    pcVar1 = this->m_buf;
    lVar4 = std::__cxx11::string::length();
    lVar5 = std::__cxx11::string::length();
    vsnprintf(pcVar1 + lVar4 + 1,0x257ff - lVar5,format,(__gnuc_va_list)((long)&str.field_2 + 8));
    this->m_buf[0x257ff] = '\0';
    if (s_writeHex == (FN_MLogWriteHex)0x0) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = (*s_writeHex)(type,this->m_hLog,this->m_buf,data,dataLen);
    }
  }
  else {
    this_local._7_1_ = false;
  }
  std::__cxx11::string::~string((string *)local_78);
  return this_local._7_1_;
}

Assistant:

bool LogWrapper::WriteHex(dd::Location& location, int type,  const char *data, unsigned short dataLen, const char *format, ... )
{
	va_list args;
	memset(m_buf, 0, MAX_BUF_SIZE);
	va_start(args, format);
	std::string str = location.ToString();
	if (str.length() >= MAX_BUF_SIZE)
		return false;
	sprintf(m_buf, "%s ", str.c_str());
	vsnprintf(m_buf + str.length() + 1, MAX_BUF_SIZE - str.length() - 1, format, args);
	m_buf[MAX_BUF_SIZE - 1] = '\0';
	va_end(args);

	if(s_writeHex != NULL)
		return s_writeHex(type, m_hLog, m_buf, data, dataLen);
	return false;
}